

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int updatewindow(z_streamp strm,uint out)

{
  internal_state *piVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  z_voidpf pvVar5;
  uint local_30;
  uint dist;
  uint copy;
  inflate_state *state;
  uint out_local;
  z_streamp strm_local;
  
  piVar1 = strm->state;
  lVar2._0_4_ = piVar1->gzindex;
  lVar2._4_1_ = piVar1->method;
  lVar2._5_3_ = *(undefined3 *)&piVar1->field_0x3d;
  if (lVar2 == 0) {
    pvVar5 = (*strm->zalloc)(strm->opaque,1 << ((byte)piVar1->pending & 0x1f),1);
    *(z_voidpf *)&piVar1->gzindex = pvVar5;
    lVar3._0_4_ = piVar1->gzindex;
    lVar3._4_1_ = piVar1->method;
    lVar3._5_3_ = *(undefined3 *)&piVar1->field_0x3d;
    if (lVar3 == 0) {
      return 1;
    }
  }
  if (piVar1->wrap == 0) {
    piVar1->wrap = 1 << ((byte)piVar1->pending & 0x1f);
    *(undefined4 *)((long)&piVar1->gzhead + 4) = 0;
    *(undefined4 *)&piVar1->gzhead = 0;
  }
  uVar4 = out - strm->avail_out;
  if (uVar4 < (uint)piVar1->wrap) {
    local_30 = piVar1->wrap - *(int *)((long)&piVar1->gzhead + 4);
    if (uVar4 < local_30) {
      local_30 = uVar4;
    }
    memcpy((void *)(*(long *)&piVar1->gzindex + (ulong)*(uint *)((long)&piVar1->gzhead + 4)),
           strm->next_out + -(ulong)uVar4,(ulong)local_30);
    uVar4 = uVar4 - local_30;
    if (uVar4 == 0) {
      *(uint *)((long)&piVar1->gzhead + 4) = local_30 + *(int *)((long)&piVar1->gzhead + 4);
      if (*(int *)((long)&piVar1->gzhead + 4) == piVar1->wrap) {
        *(undefined4 *)((long)&piVar1->gzhead + 4) = 0;
      }
      if (*(uint *)&piVar1->gzhead < (uint)piVar1->wrap) {
        *(uint *)&piVar1->gzhead = local_30 + *(int *)&piVar1->gzhead;
      }
    }
    else {
      memcpy(*(void **)&piVar1->gzindex,strm->next_out + -(ulong)uVar4,(ulong)uVar4);
      *(uint *)((long)&piVar1->gzhead + 4) = uVar4;
      *(int *)&piVar1->gzhead = piVar1->wrap;
    }
  }
  else {
    memcpy(*(void **)&piVar1->gzindex,strm->next_out + -(ulong)(uint)piVar1->wrap,
           (ulong)(uint)piVar1->wrap);
    *(undefined4 *)((long)&piVar1->gzhead + 4) = 0;
    *(int *)&piVar1->gzhead = piVar1->wrap;
  }
  return 0;
}

Assistant:

local int updatewindow(strm, out)
z_streamp strm;
unsigned out;
{
    struct inflate_state FAR *state;
    unsigned copy, dist;

    state = (struct inflate_state FAR *)strm->state;

    /* if it hasn't been done already, allocate space for the window */
    if (state->window == Z_NULL) {
        state->window = (unsigned char FAR *)
                        ZALLOC(strm, 1U << state->wbits,
                               sizeof(unsigned char));
        if (state->window == Z_NULL) return 1;
    }

    /* if window not in use yet, initialize */
    if (state->wsize == 0) {
        state->wsize = 1U << state->wbits;
        state->write = 0;
        state->whave = 0;
    }

    /* copy state->wsize or less output bytes into the circular window */
    copy = out - strm->avail_out;
    if (copy >= state->wsize) {
        zmemcpy(state->window, strm->next_out - state->wsize, state->wsize);
        state->write = 0;
        state->whave = state->wsize;
    }
    else {
        dist = state->wsize - state->write;
        if (dist > copy) dist = copy;
        zmemcpy(state->window + state->write, strm->next_out - copy, dist);
        copy -= dist;
        if (copy) {
            zmemcpy(state->window, strm->next_out - copy, copy);
            state->write = copy;
            state->whave = state->wsize;
        }
        else {
            state->write += dist;
            if (state->write == state->wsize) state->write = 0;
            if (state->whave < state->wsize) state->whave += dist;
        }
    }
    return 0;
}